

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_script.c
# Opt level: O3

char * ngx_http_set_complex_value_slot(ngx_conf_t *cf,ngx_command_t *cmd,void *conf)

{
  ngx_uint_t nVar1;
  char *pcVar2;
  ngx_int_t nVar3;
  ngx_http_compile_complex_value_t local_40;
  
  nVar1 = cmd->offset;
  if (*(long *)((long)conf + nVar1) == 0) {
    local_40.complex_value = (ngx_http_complex_value_t *)ngx_palloc(cf->pool,0x28);
    *(ngx_http_complex_value_t **)((long)conf + nVar1) = local_40.complex_value;
    if (local_40.complex_value == (ngx_http_complex_value_t *)0x0) {
      pcVar2 = (char *)0xffffffffffffffff;
    }
    else {
      local_40._24_8_ = 0;
      local_40.value = (ngx_str_t *)((long)cf->args->elts + 0x10);
      local_40.cf = cf;
      nVar3 = ngx_http_compile_complex_value(&local_40);
      pcVar2 = (char *)-(ulong)(nVar3 != 0);
    }
  }
  else {
    pcVar2 = "is duplicate";
  }
  return pcVar2;
}

Assistant:

char *
ngx_http_set_complex_value_slot(ngx_conf_t *cf, ngx_command_t *cmd, void *conf)
{
    char  *p = conf;

    ngx_str_t                          *value;
    ngx_http_complex_value_t          **cv;
    ngx_http_compile_complex_value_t    ccv;

    cv = (ngx_http_complex_value_t **) (p + cmd->offset);

    if (*cv != NULL) {
        return "is duplicate";
    }

    *cv = ngx_palloc(cf->pool, sizeof(ngx_http_complex_value_t));
    if (*cv == NULL) {
        return NGX_CONF_ERROR;
    }

    value = cf->args->elts;

    ngx_memzero(&ccv, sizeof(ngx_http_compile_complex_value_t));

    ccv.cf = cf;
    ccv.value = &value[1];
    ccv.complex_value = *cv;

    if (ngx_http_compile_complex_value(&ccv) != NGX_OK) {
        return NGX_CONF_ERROR;
    }

    return NGX_CONF_OK;
}